

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GUFA.cpp
# Opt level: O0

void __thiscall wasm::anon_unknown_234::GUFAPass::run(GUFAPass *this,Module *module)

{
  PassRunner *runner;
  GUFAOptimizer local_1a8;
  undefined1 local_58 [8];
  ContentOracle oracle;
  Module *module_local;
  GUFAPass *this_local;
  
  oracle.locationContents._M_h._M_single_bucket = (__node_base_ptr)module;
  ContentOracle::ContentOracle((ContentOracle *)local_58,module);
  GUFAOptimizer::GUFAOptimizer(&local_1a8,(ContentOracle *)local_58,(bool)(this->optimizing & 1));
  runner = Pass::getPassRunner(&this->super_Pass);
  WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::GUFAOptimizer,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::GUFAOptimizer,_void>_>_>
  ::run(&local_1a8.
         super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::GUFAOptimizer,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::GUFAOptimizer,_void>_>_>
        ,runner,(Module *)oracle.locationContents._M_h._M_single_bucket);
  GUFAOptimizer::~GUFAOptimizer(&local_1a8);
  ContentOracle::~ContentOracle((ContentOracle *)local_58);
  return;
}

Assistant:

void run(Module* module) override {
    ContentOracle oracle(*module);
    GUFAOptimizer(oracle, optimizing).run(getPassRunner(), module);
  }